

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::addItem(QGraphicsScene *this,QGraphicsItem *item)

{
  undefined1 *puVar1;
  int *piVar2;
  QGraphicsScene *this_00;
  QGraphicsScenePrivate *this_01;
  Data *pDVar3;
  QGraphicsWidgetPrivate *this_02;
  QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
  *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  qreal qVar6;
  QGraphicsItemPrivate *pQVar7;
  qreal qVar8;
  long lVar9;
  QGraphicsItem **ppQVar10;
  QGraphicsView **ppQVar11;
  bool bVar12;
  int iVar13;
  WindowType WVar14;
  PanelModality PVar15;
  uint uVar16;
  QMetaType QVar17;
  anon_union_24_3_e3d07ef4_for_data *paVar18;
  _Base_ptr p_Var19;
  QGraphicsWidget *pQVar20;
  size_t sVar21;
  QGraphicsItem *pQVar22;
  _Rb_tree_node_base *p_Var23;
  PrivateShared *this_03;
  long lVar24;
  size_t sVar25;
  long in_FS_OFFSET;
  QMetaMethod QVar26;
  QGraphicsScene *t;
  QVariant local_98;
  QGraphicsItem *copy;
  char *pcStack_70;
  QMetaTypeInterface *local_68;
  qreal qStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    addItem();
    goto LAB_006132d2;
  }
  this_00 = (QGraphicsScene *)((item->d_ptr).d)->scene;
  if (this_00 == this) {
    addItem();
    goto LAB_006132d2;
  }
  this_01 = *(QGraphicsScenePrivate **)(this + 8);
  if (this_00 != (QGraphicsScene *)0x0) {
    removeItem(this_00,item);
  }
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  t = (QGraphicsScene *)this;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType);
  }
  ::QVariant::moveConstruct
            ((QMetaTypeInterface *)&copy,
             &QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType);
  paVar18 = &local_58;
  (*item->_vptr_QGraphicsItem[0x21])(paVar18,item,0xb);
  ::QVariant::~QVariant((QVariant *)&copy);
  copy = (QGraphicsItem *)&QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType;
  t = (QGraphicsScene *)((ulong)puStack_40 & 0xfffffffffffffffc);
  bVar12 = comparesEqual((QMetaType *)&t,(QMetaType *)&copy);
  if (bVar12) {
    if (((ulong)puStack_40 & 1) == 0) {
      paVar18 = &local_58;
    }
    else {
      paVar18 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_58.shared + *(int *)(local_58.shared + 4));
    }
    this_03 = paVar18->shared;
  }
  else {
    t = (QGraphicsScene *)0x0;
    QVar17.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if (((ulong)puStack_40 & 1) != 0) {
      paVar18 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_58.shared + *(int *)(local_58.shared + 4));
    }
    QMetaType::convert(QVar17,paVar18,(QMetaType)copy,&t);
    this_03 = (PrivateShared *)t;
  }
  if (this_03 == (PrivateShared *)this) {
    if ((this_01->unpolishedItems).d.size == 0) {
      iVar13 = (*(code *)**(undefined8 **)this)(this);
      QVar26 = (QMetaMethod)QMetaObject::method(iVar13);
      copy = (QGraphicsItem *)0x0;
      pcStack_70 = (char *)0x0;
      local_68 = (QMetaTypeInterface *)0x0;
      QMetaMethod::invokeImpl(QVar26,this,QueuedConnection,1,&copy,&pcStack_70,&local_68);
    }
    copy = item;
    QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
              ((QPodArrayOps<QGraphicsItem*> *)&this_01->unpolishedItems,
               (this_01->unpolishedItems).d.size,&copy);
    QList<QGraphicsItem_*>::end(&this_01->unpolishedItems);
    puVar1 = &((item->d_ptr).d)->field_0x168;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
    pQVar22 = ((item->d_ptr).d)->parent;
    if ((pQVar22 != (QGraphicsItem *)0x0) && ((QGraphicsScene *)((pQVar22->d_ptr).d)->scene != this)
       ) {
      QGraphicsItem::setParentItem(item,(QGraphicsItem *)0x0);
    }
    ((item->d_ptr).d)->scene = (QGraphicsScene *)this_03;
    (**(code **)(*(long *)this_01->index + 0xb0))(this_01->index,item);
    if (((item->d_ptr).d)->parent == (QGraphicsItem *)0x0) {
      QGraphicsScenePrivate::registerTopLevelItem(this_01,item);
    }
    local_68 = (QMetaTypeInterface *)0x0;
    qStack_60 = 0.0;
    copy = (QGraphicsItem *)0x0;
    pcStack_70 = (char *)0x0;
    sVar25 = 0;
    pQVar22 = item;
    QGraphicsScenePrivate::markDirty(this_01,item,(QRectF *)&copy,false,false,false,false,false);
    uVar16 = *(uint *)&this_01->field_0xb8;
    *(uint *)&this_01->field_0xb8 = uVar16 | 2;
    this_01->selectionChanging = this_01->selectionChanging + 1;
    pDVar3 = (this_01->selectedItems).q_hash.d;
    if (pDVar3 != (Data *)0x0) {
      sVar25 = (size_t)(int)pDVar3->size;
    }
    if ((uVar16 >> 0xc & 1) != 0) {
      this_02 = (QGraphicsWidgetPrivate *)(item->d_ptr).d;
      uVar16 = (uint)*(undefined8 *)&(this_02->super_QGraphicsItemPrivate).field_0x160;
      if ((uVar16 >> 10 & 1) == 0) {
        if ((uVar16 >> 0x18 & 1) != 0) {
          bVar12 = QGraphicsWidgetPrivate::hasDecoration(this_02);
          if (bVar12) goto LAB_00612ef6;
        }
      }
      else {
LAB_00612ef6:
        this_01->field_0xb9 = this_01->field_0xb9 & 0xef;
        QGraphicsScenePrivate::enableMouseTrackingOnViews(this_01);
      }
    }
    uVar16 = *(uint *)&this_01->field_0xb8;
    if ((((uVar16 >> 0xd & 1) != 0) && ((((item->d_ptr).d)->field_0x161 & 0x80) != 0)) &&
       (*(uint *)&this_01->field_0xb8 = uVar16 & 0xffffdfff, (uVar16 >> 0xc & 1) != 0)) {
      QGraphicsScenePrivate::enableMouseTrackingOnViews(this_01);
    }
    if (((*(uint *)&this_01->field_0xb8 >> 0x10 & 1) != 0) &&
       ((((item->d_ptr).d)->field_0x167 & 8) != 0)) {
      *(uint *)&this_01->field_0xb8 = *(uint *)&this_01->field_0xb8 & 0xfffeffff;
      QGraphicsScenePrivate::enableTouchEventsOnViews(this_01);
    }
    pQVar4 = (((item->d_ptr).d)->gestureContext).d.d.ptr;
    if (pQVar4 == (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                   *)0x0) {
      p_Var19 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var19 = (pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    while( true ) {
      pQVar4 = (((item->d_ptr).d)->gestureContext).d.d.ptr;
      p_Var23 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar4 == (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
                     *)0x0) {
        p_Var23 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var19 == p_Var23) break;
      QGraphicsScenePrivate::grabGesture(this_01,pQVar22,p_Var19[1]._M_color);
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    }
    bVar12 = QGraphicsItem::isSelected(item);
    if (bVar12) {
      copy = item;
      QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QGraphicsItem*,QHashDummyValue> *)&this_01->selectedItems,&copy,
                 (QHashDummyValue *)&t);
    }
    bVar12 = QGraphicsItem::isWidget(item);
    if (bVar12) {
      bVar12 = QGraphicsItem::isVisible(item);
      if (bVar12) {
        WVar14 = QGraphicsWidget::windowType((QGraphicsWidget *)(item + -1));
        if (WVar14 == Popup) {
          QGraphicsScenePrivate::addPopup(this_01,(QGraphicsWidget *)(item + -1));
        }
      }
    }
    bVar12 = QGraphicsItem::isPanel(item);
    if (bVar12) {
      bVar12 = QGraphicsItem::isVisible(item);
      if (bVar12) {
        PVar15 = QGraphicsItem::panelModality(item);
        if (PVar15 != NonModal) {
          QGraphicsScenePrivate::enterModal(this_01,item,NonModal);
        }
      }
    }
    bVar12 = QGraphicsItem::isWidget(item);
    if (bVar12) {
      if (this_01->tabFocusFirst == (QGraphicsWidget *)0x0) {
        this_01->tabFocusFirst = (QGraphicsWidget *)(item + -1);
      }
      else {
        pQVar20 = QGraphicsItem::parentWidget(item);
        if (pQVar20 == (QGraphicsWidget *)0x0) {
          bVar12 = QGraphicsItem::isPanel(item);
          if (!bVar12) {
            pQVar20 = this_01->tabFocusFirst;
            pQVar5 = (pQVar20->super_QGraphicsObject).super_QGraphicsItem.d_ptr.d;
            qVar6 = pQVar5[1].needsRepaint.w;
            *(QGraphicsWidget **)(*(long *)((long)qVar6 + 0x18) + 0x1c0) =
                 (QGraphicsWidget *)(item + -1);
            pQVar7 = (item->d_ptr).d;
            qVar8 = pQVar7[1].needsRepaint.w;
            *(QGraphicsWidget **)(*(long *)((long)qVar8 + 0x18) + 0x1c0) = pQVar20;
            pQVar5[1].needsRepaint.w = qVar8;
            pQVar7[1].needsRepaint.w = qVar6;
          }
        }
      }
    }
    QGraphicsItemPrivate::ensureSortedChildren((item->d_ptr).d);
    pQVar5 = (item->d_ptr).d;
    lVar9 = (pQVar5->children).d.size;
    if (lVar9 != 0) {
      ppQVar10 = (pQVar5->children).d.ptr;
      lVar24 = 0;
      do {
        addItem(this,*(QGraphicsItem **)((long)ppQVar10 + lVar24));
        lVar24 = lVar24 + 8;
      } while (lVar9 << 3 != lVar24);
    }
    pQVar5 = (item->d_ptr).d;
    (*pQVar5->_vptr_QGraphicsItemPrivate[5])(pQVar5,(ulong)*(uint *)&this_01->field_0x2b0);
    pQVar5 = (item->d_ptr).d;
    uVar16 = QPalette::resolveMask();
    (*pQVar5->_vptr_QGraphicsItemPrivate[6])(pQVar5,(ulong)uVar16);
    piVar2 = &this_01->selectionChanging;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      pDVar3 = (this_01->selectedItems).q_hash.d;
      if (pDVar3 == (Data *)0x0) {
        sVar21 = 0;
      }
      else {
        sVar21 = pDVar3->size;
      }
      if (sVar21 != sVar25) {
        QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
      }
    }
    (*item->_vptr_QGraphicsItem[0x21])(&local_98,item,0x10);
    ::QVariant::~QVariant(&local_98);
    if ((this_01->childExplicitActivation == 0) &&
       (uVar16 = *(uint *)&((item->d_ptr).d)->field_0x168, (uVar16 & 4) != 0)) {
      this_01->childExplicitActivation = ((uVar16 & 8) == 0) + 1;
    }
    if (this_01->childExplicitActivation == 0) {
LAB_00613211:
      if (((item->d_ptr).d)->parent == (QGraphicsItem *)0x0) {
LAB_00613223:
        this_01->childExplicitActivation = 0;
      }
      if ((this_01->lastActivePanel == (QGraphicsItem *)0x0) &&
         (this_01->activePanel == (QGraphicsItem *)0x0)) {
        bVar12 = QGraphicsItem::isPanel(item);
        if (bVar12) {
          if ((*(QGraphicsScenePrivate **)(this + 8))->activationRefCount < 1) {
            this_01->lastActivePanel = item;
          }
          else {
            QGraphicsScenePrivate::setActivePanelHelper
                      (*(QGraphicsScenePrivate **)(this + 8),item,false);
          }
        }
      }
    }
    else {
      bVar12 = QGraphicsItem::isPanel(item);
      if (!bVar12) goto LAB_00613211;
      if (this_01->childExplicitActivation == 1) {
        QGraphicsScenePrivate::setActivePanelHelper
                  (*(QGraphicsScenePrivate **)(this + 8),item,false);
        goto LAB_00613223;
      }
      this_01->childExplicitActivation = 0;
    }
    if ((((item->d_ptr).d)->field_0x166 & 1) != 0) {
      QGraphicsScenePrivate::registerScenePosItem(this_01,item);
    }
    if ((this_01->focusItem == (QGraphicsItem *)0x0) && (this_01->lastFocusItem != item)) {
      pQVar22 = QGraphicsItem::focusItem(item);
      if (pQVar22 == item) {
        pQVar22 = QGraphicsItem::focusItem(item);
        QGraphicsItem::setFocus(pQVar22,OtherFocusReason);
      }
    }
    lVar9 = (this_01->views).d.size;
    if (lVar9 != 0) {
      ppQVar11 = (this_01->views).d.ptr;
      lVar24 = 0;
      do {
        QGraphicsViewPrivate::updateInputMethodSensitivity
                  (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar11 + lVar24) + 8));
        lVar24 = lVar24 + 8;
      } while (lVar9 << 3 != lVar24);
    }
  }
  else if ((this_03 != (PrivateShared *)0x0) &&
          ((QGraphicsScene *)((item->d_ptr).d)->scene != (QGraphicsScene *)this_03)) {
    addItem((QGraphicsScene *)this_03,item);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_006132d2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::addItem(QGraphicsItem *item)
{
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::addItem: cannot add null item");
        return;
    }
    if (item->d_ptr->scene == this) {
        qWarning("QGraphicsScene::addItem: item has already been added to this scene");
        return;
    }
    // Remove this item from its existing scene
    if (QGraphicsScene *oldScene = item->d_ptr->scene)
        oldScene->removeItem(item);

    // Notify the item that its scene is changing, and allow the item to
    // react.
    const QVariant newSceneVariant(item->itemChange(QGraphicsItem::ItemSceneChange,
                                                    QVariant::fromValue<QGraphicsScene *>(this)));
    QGraphicsScene *targetScene = qvariant_cast<QGraphicsScene *>(newSceneVariant);
    if (targetScene != this) {
        if (targetScene && item->d_ptr->scene != targetScene)
            targetScene->addItem(item);
        return;
    }

    if (d->unpolishedItems.isEmpty()) {
        QMetaMethod method = metaObject()->method(d->polishItemsIndex);
        method.invoke(this, Qt::QueuedConnection);
    }
    d->unpolishedItems.append(item);
    item->d_ptr->pendingPolish = true;

    // Detach this item from its parent if the parent's scene is different
    // from this scene.
    if (QGraphicsItem *itemParent = item->d_ptr->parent) {
        if (itemParent->d_ptr->scene != this)
            item->setParentItem(nullptr);
    }

    // Add the item to this scene
    item->d_func()->scene = targetScene;

    // Add the item in the index
    d->index->addItem(item);

    // Add to list of toplevels if this item is a toplevel.
    if (!item->d_ptr->parent)
        d->registerTopLevelItem(item);

    // Add to list of items that require an update. We cannot assume that the
    // item is fully constructed, so calling item->update() can lead to a pure
    // virtual function call to boundingRect().
    d->markDirty(item);
    d->dirtyGrowingItemsBoundingRect = true;

    // Disable selectionChanged() for individual items
    ++d->selectionChanging;
    int oldSelectedItemSize = d->selectedItems.size();

    // Enable mouse tracking if we haven't already done so, and the item needs it.
    // We cannot use itemAcceptsHoverEvents_helper() here, since we need to enable
    // mouse tracking also if this item is temporarily blocked by a modal panel.

    auto needsMouseTracking = [](const QGraphicsItemPrivate *item) {
        return item->acceptsHover
                || (item->isWidget && static_cast<const QGraphicsWidgetPrivate *>(item)->hasDecoration());
    };

    if (d->allItemsIgnoreHoverEvents && needsMouseTracking(item->d_ptr.data())) {
        d->allItemsIgnoreHoverEvents = false;
        d->enableMouseTrackingOnViews();
    }
#ifndef QT_NO_CURSOR
    if (d->allItemsUseDefaultCursor && item->d_ptr->hasCursor) {
        d->allItemsUseDefaultCursor = false;
        if (d->allItemsIgnoreHoverEvents) // already enabled otherwise
            d->enableMouseTrackingOnViews();
    }
#endif //QT_NO_CURSOR

    // Enable touch events if the item accepts touch events.
    if (d->allItemsIgnoreTouchEvents && item->d_ptr->acceptTouchEvents) {
        d->allItemsIgnoreTouchEvents = false;
        d->enableTouchEventsOnViews();
    }

#ifndef QT_NO_GESTURES
    for (auto it = item->d_ptr->gestureContext.constBegin();
              it != item->d_ptr->gestureContext.constEnd(); ++it)
        d->grabGesture(item, it.key());
#endif

    // Update selection lists
    if (item->isSelected())
        d->selectedItems << item;
    if (item->isWidget() && item->isVisible() && static_cast<QGraphicsWidget *>(item)->windowType() == Qt::Popup)
        d->addPopup(static_cast<QGraphicsWidget *>(item));
    if (item->isPanel() && item->isVisible() && item->panelModality() != QGraphicsItem::NonModal)
        d->enterModal(item);

    // Update creation order focus chain. Make sure to leave the widget's
    // internal tab order intact.
    if (item->isWidget()) {
        QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(item);
        if (!d->tabFocusFirst) {
            // No first tab focus widget - make this the first tab focus
            // widget.
            d->tabFocusFirst = widget;
        } else if (!widget->parentWidget() && !widget->isPanel()) {
            // Adding a widget that is not part of a tab focus chain.
            QGraphicsWidget *myNewPrev = d->tabFocusFirst->d_func()->focusPrev;
            myNewPrev->d_func()->focusNext = widget;
            widget->d_func()->focusPrev->d_func()->focusNext = d->tabFocusFirst;
            d->tabFocusFirst->d_func()->focusPrev = widget->d_func()->focusPrev;
            widget->d_func()->focusPrev = myNewPrev;
        }
    }

    // Add all children recursively
    item->d_ptr->ensureSortedChildren();
    for (auto child : std::as_const(item->d_ptr->children))
        addItem(child);

    // Resolve font and palette.
    item->d_ptr->resolveFont(d->font.resolveMask());
    item->d_ptr->resolvePalette(d->palette.resolveMask());


    // Re-enable selectionChanged() for individual items
    --d->selectionChanging;
    if (!d->selectionChanging && d->selectedItems.size() != oldSelectedItemSize)
        emit selectionChanged();

    // Deliver post-change notification
    item->itemChange(QGraphicsItem::ItemSceneHasChanged, newSceneVariant);

    // Update explicit activation
    bool autoActivate = true;
    if (!d->childExplicitActivation && item->d_ptr->explicitActivate)
        d->childExplicitActivation = item->d_ptr->wantsActive ? 1 : 2;
    if (d->childExplicitActivation && item->isPanel()) {
        if (d->childExplicitActivation == 1)
            setActivePanel(item);
        else
            autoActivate = false;
        d->childExplicitActivation = 0;
    } else if (!item->d_ptr->parent) {
        d->childExplicitActivation = 0;
    }

    // Auto-activate this item's panel if nothing else has been activated
    if (autoActivate) {
        if (!d->lastActivePanel && !d->activePanel && item->isPanel()) {
            if (isActive())
                setActivePanel(item);
            else
                d->lastActivePanel = item;
        }
    }

    if (item->d_ptr->flags & QGraphicsItem::ItemSendsScenePositionChanges)
        d->registerScenePosItem(item);

    // Ensure that newly added items that have subfocus set, gain
    // focus automatically if there isn't a focus item already.
    if (!d->focusItem && item != d->lastFocusItem && item->focusItem() == item)
        item->focusItem()->setFocus();

    d->updateInputMethodSensitivityInViews();
}